

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper.c
# Opt level: O0

void glfwEventRelease(GLFWEvent *event)

{
  GLFWEvent *event_local;
  
  if (event != (GLFWEvent *)0x0) {
    if ((GLFWEventPoolSize != 0) && (GLFWEventPool == (GLFWEvent *)0x0)) {
      __assert_fail("GLFWEventPoolSize == 0 || GLFWEventPool",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/creationix[P]lit-glfw/wrapper.c"
                    ,0x17,"void glfwEventRelease(GLFWEvent *)");
    }
    if (GLFWEventPoolSize < 10) {
      event->next = GLFWEventPool;
      GLFWEventPoolSize = GLFWEventPoolSize + 1;
      GLFWEventPool = event;
    }
    else {
      free(event);
    }
  }
  return;
}

Assistant:

void glfwEventRelease(GLFWEvent* event) {
  if (!event) return;
  assert(GLFWEventPoolSize == 0 || GLFWEventPool);
  if (GLFWEventPoolSize < GLFWEventPoolMaxSize) {
    event->next = GLFWEventPool;
    GLFWEventPool = event;
    GLFWEventPoolSize++;
  }
  else {
    // The recycling pool is large enough, let's free this one.
    free(event);
  }
}